

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O2

bool __thiscall QMainWindow::restoreState(QMainWindow *this,QByteArray *state,int version)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  int v;
  int marker;
  QArrayDataPointer<char> local_60;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (state->d).size;
  if (lVar1 == 0) {
    bVar2 = false;
  }
  else {
    local_60.d = (state->d).d;
    local_60.ptr = (state->d).ptr;
    if (local_60.d != (Data *)0x0) {
      LOCK();
      ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_38 = 0xaaaaaaaa;
    uStack_34 = 0xaaaaaaaa;
    uStack_30 = 0xaaaaaaaa;
    uStack_2c = 0xaaaaaaaa;
    local_48 = 0xaaaaaaaa;
    uStack_44 = 0xaaaaaaaa;
    uStack_40 = 0xaaaaaaaa;
    uStack_3c = 0xaaaaaaaa;
    local_60.size = lVar1;
    QDataStream::QDataStream((QDataStream *)&local_48,&local_60,1);
    uStack_30 = 0xd;
    marker = -0x55555556;
    v = -0x55555556;
    QDataStream::operator>>((QDataStream *)&local_48,&marker);
    QDataStream::operator>>((QDataStream *)&local_48,&v);
    bVar2 = false;
    if (((local_38._3_1_ == '\0') && (bVar2 = false, marker == 0xff)) && (v == version)) {
      bVar2 = QMainWindowLayout::restoreState
                        (*(QMainWindowLayout **)(*(long *)&(this->super_QWidget).field_0x8 + 0x260),
                         (QDataStream *)&local_48);
    }
    QDataStream::~QDataStream((QDataStream *)&local_48);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QMainWindow::restoreState(const QByteArray &state, int version)
{
    if (state.isEmpty())
        return false;
    QByteArray sd = state;
    QDataStream stream(&sd, QIODevice::ReadOnly);
    stream.setVersion(QDataStream::Qt_5_0);
    int marker, v;
    stream >> marker;
    stream >> v;
    if (stream.status() != QDataStream::Ok || marker != QMainWindowLayout::VersionMarker || v != version)
        return false;
    bool restored = d_func()->layout->restoreState(stream);
    return restored;
}